

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkPointSpline.cpp
# Opt level: O3

void __thiscall
chrono::ChLinkPointSpline::ChLinkPointSpline(ChLinkPointSpline *this,ChLinkPointSpline *other)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  int iVar2;
  undefined4 extraout_var;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_20 [2];
  
  ChLinkLockLock::ChLinkLockLock(&this->super_ChLinkLockLock,&other->super_ChLinkLockLock);
  (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.super_ChLink.super_ChLinkBase.
  super_ChPhysicsItem.super_ChObj._vptr_ChObj = &PTR__ChLinkPointSpline_00b1b018;
  (this->trajectory_line).super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->trajectory_line).super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  iVar2 = (*(((other->trajectory_line).
              super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_ChGeometry)._vptr_ChGeometry[2])();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::geometry::ChLine*>
            (a_Stack_20,(ChLine *)CONCAT44(extraout_var,iVar2));
  _Var1._M_pi = a_Stack_20[0]._M_pi;
  a_Stack_20[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->trajectory_line).
            super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  (this->trajectory_line).super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (ChLine *)CONCAT44(extraout_var,iVar2);
  (this->trajectory_line).super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var1._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    if (a_Stack_20[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_20[0]._M_pi);
    }
  }
  this->tolerance = other->tolerance;
  return;
}

Assistant:

ChLinkPointSpline::ChLinkPointSpline(const ChLinkPointSpline& other) : ChLinkLockLock(other) {
    trajectory_line = std::shared_ptr<ChLine>((ChLine*)other.trajectory_line->Clone());  // deep copy
    tolerance = other.tolerance;
}